

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_reader.h
# Opt level: O2

string_view __thiscall
absl::lts_20250127::cord_internal::CordRepBtreeReader::Init
          (CordRepBtreeReader *this,CordRepBtree *tree)

{
  CordRep *edge;
  string_view sVar1;
  
  if (tree != (CordRepBtree *)0x0) {
    edge = CordRepBtreeNavigator::Init<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                     (&this->navigator_,tree);
    this->remaining_ = (tree->super_CordRep).length - edge->length;
    sVar1 = EdgeData(edge);
    return sVar1;
  }
  __assert_fail("tree != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree_reader.h"
                ,0xa8,
                "absl::string_view absl::cord_internal::CordRepBtreeReader::Init(CordRepBtree *)");
}

Assistant:

inline absl::string_view CordRepBtreeReader::Init(CordRepBtree* tree) {
  assert(tree != nullptr);
  const CordRep* edge = navigator_.InitFirst(tree);
  remaining_ = tree->length - edge->length;
  return EdgeData(edge);
}